

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::Texture2D::Texture2D(Texture2D *this,deUint32 name)

{
  deUint32 name_local;
  Texture2D *this_local;
  
  Texture::Texture(&this->super_Texture,name,TYPE_2D);
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture2D_015cca58
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::Texture2DView::Texture2DView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

Texture2D::Texture2D (deUint32 name)
	: Texture	(name, TYPE_2D)
	, m_view	(0, DE_NULL)
{
}